

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# foreach.c
# Opt level: O1

rxc_sink * rxc_sink_foreach(_func_void_void_ptr *callback)

{
  rxc_sink *prVar1;
  
  prVar1 = (rxc_sink *)malloc(0x18);
  if (prVar1 == (rxc_sink *)0x0) {
    prVar1 = (rxc_sink *)0x0;
  }
  else {
    prVar1[1].dealloc = (_func_void_rxc_sink_ptr_int *)callback;
    prVar1->dealloc = dealloc;
    prVar1->create_logic = create_logic;
  }
  return prVar1;
}

Assistant:

struct rxc_sink * rxc_sink_foreach(void (*callback)(void *element))
{
    struct rxc_sink_foreach *sink = malloc(sizeof(struct rxc_sink_foreach));

    if (!sink) {
        return NULL;
    }

    sink->callback = callback;
    sink->base.dealloc = dealloc;
    sink->base.create_logic = create_logic;

    return &sink->base;
}